

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerInvulnerable::DoEffect(APowerInvulnerable *this)

{
  bool bVar1;
  uint uVar2;
  AActor *pAVar3;
  Self local_1c;
  Self local_18;
  TFlags<ActorFlag,_unsigned_int> local_14;
  APowerInvulnerable *local_10;
  APowerInvulnerable *this_local;
  
  local_10 = this;
  APowerup::DoEffect(&this->super_APowerup);
  bVar1 = TObjPtr<AActor>::operator==(&(this->super_APowerup).super_AInventory.Owner,(AActor *)0x0);
  if ((!bVar1) &&
     (bVar1 = FName::operator==(&(this->super_APowerup).Mode.super_FName,NAME_Ghost), bVar1)) {
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_14,(int)pAVar3 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_14);
    if (uVar2 == 0) {
      pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
      FRenderStyle::operator=((FRenderStyle *)&(pAVar3->RenderStyle).field_0,STYLE_Translucent);
      if ((((::level.time & 7U) == 0) &&
          (pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner),
          0.0 < pAVar3->Alpha)) &&
         (pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner),
         pAVar3->Alpha <= 1.0 && pAVar3->Alpha != 1.0)) {
        pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        if ((pAVar3->Alpha != 0.59375) || (NAN(pAVar3->Alpha))) {
          pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
          pAVar3->Alpha = 0.0;
          pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
          TFlags<ActorFlag2,_unsigned_int>::operator|=(&pAVar3->flags2,MF2_NONSHOOTABLE);
        }
        else {
          pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
          pAVar3->Alpha = 0.40625;
        }
      }
      if ((::level.time & 0x1fU) == 0) {
        pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        if ((pAVar3->Alpha != 0.0) || (NAN(pAVar3->Alpha))) {
          pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
          pAVar3->Alpha = 0.59375;
        }
        else {
          operator~((EnumType)&local_18);
          pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
          TFlags<ActorFlag2,_unsigned_int>::operator&=(&pAVar3->flags2,&local_18);
          pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
          pAVar3->Alpha = 0.40625;
        }
      }
    }
    else {
      operator~((EnumType)&local_1c);
      pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
      TFlags<ActorFlag2,_unsigned_int>::operator&=(&pAVar3->flags2,&local_1c);
    }
  }
  return;
}

Assistant:

void APowerInvulnerable::DoEffect ()
{
	Super::DoEffect ();

	if (Owner == NULL)
	{
		return;
	}

	if (Mode == NAME_Ghost)
	{
		if (!(Owner->flags & MF_SHADOW))
		{
			// Don't mess with the translucency settings if an
			// invisibility powerup is active.
			Owner->RenderStyle = STYLE_Translucent;
			if (!(level.time & 7) && Owner->Alpha > 0 && Owner->Alpha < 1)
			{
				if (Owner->Alpha == HX_SHADOW)
				{
					Owner->Alpha = HX_ALTSHADOW;
				}
				else
				{
					Owner->Alpha = 0;
					Owner->flags2 |= MF2_NONSHOOTABLE;
				}
			}
			if (!(level.time & 31))
			{
				if (Owner->Alpha == 0)
				{
					Owner->flags2 &= ~MF2_NONSHOOTABLE;
					Owner->Alpha = HX_ALTSHADOW;
				}
				else
				{
					Owner->Alpha = HX_SHADOW;
				}
			}
		}
		else
		{
			Owner->flags2 &= ~MF2_NONSHOOTABLE;
		}
	}
}